

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool *bufPool)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  pthread_mutex_t *in_RDI;
  void *unaff_retaddr;
  uint u;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  if (in_RDI != (pthread_mutex_t *)0x0) {
    for (uVar1 = 0; uVar1 < *(uint *)((long)in_RDI + 0x30); uVar1 = uVar1 + 1) {
      customMem.customAlloc._4_4_ = uVar1;
      customMem.customAlloc._0_4_ = in_stack_fffffffffffffff0;
      customMem.customFree = (ZSTD_freeFunction)in_RDI;
      customMem.opaque = unaff_retaddr;
      ZSTD_customFree(*(void **)((long)in_RDI + 0x40),customMem);
    }
    pthread_mutex_destroy(in_RDI);
    customMem_00.customAlloc._4_4_ = uVar1;
    customMem_00.customAlloc._0_4_ = in_stack_fffffffffffffff0;
    customMem_00.customFree = (ZSTD_freeFunction)in_RDI;
    customMem_00.opaque = unaff_retaddr;
    ZSTD_customFree(*(void **)((long)in_RDI + 0x40),customMem_00);
  }
  return;
}

Assistant:

static void ZSTDMT_freeBufferPool(ZSTDMT_bufferPool* bufPool)
{
    unsigned u;
    DEBUGLOG(3, "ZSTDMT_freeBufferPool (address:%08X)", (U32)(size_t)bufPool);
    if (!bufPool) return;   /* compatibility with free on NULL */
    for (u=0; u<bufPool->totalBuffers; u++) {
        DEBUGLOG(4, "free buffer %2u (address:%08X)", u, (U32)(size_t)bufPool->bTable[u].start);
        ZSTD_customFree(bufPool->bTable[u].start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_destroy(&bufPool->poolMutex);
    ZSTD_customFree(bufPool, bufPool->cMem);
}